

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SmallHTTPPartialMatchPCRE(int n)

{
  int iVar1;
  bool bVar2;
  Arg local_b0;
  StringPiece local_a0;
  StringPiece a;
  PCRE re;
  
  a.ptr_ = (char *)0x0;
  a.length_ = 0;
  PCRE::PCRE(&re,"(?-s)^(?:GET|POST) +([^ ]+) HTTP");
  iVar1 = 0;
  if (0 < n) {
    iVar1 = n;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_a0.ptr_ = smallhttp_text_abi_cxx11_;
    local_a0.length_ = DAT_001696d0;
    local_b0.arg_ = &a;
    local_b0.parser_ = PCRE::Arg::parse_stringpiece;
    PCRE::PartialMatchFunctor::operator()
              ((PartialMatchFunctor *)&PCRE::PartialMatch,&local_a0,&re,&local_b0,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
  }
  PCRE::~PCRE(&re);
  return;
}

Assistant:

void SmallHTTPPartialMatchPCRE(int n) {
  StringPiece a;
  PCRE re("(?-s)^(?:GET|POST) +([^ ]+) HTTP");
  for (int i = 0; i < n; i++) {
    PCRE::PartialMatch(smallhttp_text, re, &a);
  }
}